

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_string_field.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::ImmutableStringFieldGenerator::GenerateKotlinDslMembers
          (ImmutableStringFieldGenerator *this,Printer *printer)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *variables;
  bool bVar1;
  
  WriteFieldDocComment(printer,this->descriptor_);
  variables = &this->variables_;
  io::Printer::Print(printer,variables,
                     "$kt_deprecation$public var $kt_name$: kotlin.String\n  @JvmName(\"${$get$kt_capitalized_name$$}$\")\n  get() = $kt_dsl_builder$.${$get$capitalized_name$$}$()\n  @JvmName(\"${$set$kt_capitalized_name$$}$\")\n  set(value) {\n    $kt_dsl_builder$.${$set$capitalized_name$$}$(value)\n  }\n"
                    );
  WriteFieldAccessorDocComment(printer,this->descriptor_,CLEARER,false);
  io::Printer::Print(printer,variables,
                     "public fun ${$clear$kt_capitalized_name$$}$() {\n  $kt_dsl_builder$.${$clear$capitalized_name$$}$()\n}\n"
                    );
  bVar1 = HasHazzer(this->descriptor_);
  if (bVar1) {
    WriteFieldAccessorDocComment(printer,this->descriptor_,HAZZER,false);
    io::Printer::Print(printer,variables,
                       "public fun ${$has$kt_capitalized_name$$}$(): kotlin.Boolean {\n  return $kt_dsl_builder$.${$has$capitalized_name$$}$()\n}\n"
                      );
    return;
  }
  return;
}

Assistant:

void ImmutableStringFieldGenerator::GenerateKotlinDslMembers(
    io::Printer* printer) const {
  WriteFieldDocComment(printer, descriptor_);
  printer->Print(variables_,
                 "$kt_deprecation$public var $kt_name$: kotlin.String\n"
                 "  @JvmName(\"${$get$kt_capitalized_name$$}$\")\n"
                 "  get() = $kt_dsl_builder$.${$get$capitalized_name$$}$()\n"
                 "  @JvmName(\"${$set$kt_capitalized_name$$}$\")\n"
                 "  set(value) {\n"
                 "    $kt_dsl_builder$.${$set$capitalized_name$$}$(value)\n"
                 "  }\n");

  WriteFieldAccessorDocComment(printer, descriptor_, CLEARER,
                               /* builder */ false);
  printer->Print(variables_,
                 "public fun ${$clear$kt_capitalized_name$$}$() {\n"
                 "  $kt_dsl_builder$.${$clear$capitalized_name$$}$()\n"
                 "}\n");

  if (HasHazzer(descriptor_)) {
    WriteFieldAccessorDocComment(printer, descriptor_, HAZZER);
    printer->Print(
        variables_,
        "public fun ${$has$kt_capitalized_name$$}$(): kotlin.Boolean {\n"
        "  return $kt_dsl_builder$.${$has$capitalized_name$$}$()\n"
        "}\n");
  }
}